

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_ObjSlack(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x113,"int Acb_ObjLevelD(Acb_Ntk_t *, int)");
  }
  if (((p->vLevelD).nSize <= iObj) || ((p->vLevelR).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  iVar2 = (p->vLevelR).pArray[(uint)iObj] + (p->vLevelD).pArray[(uint)iObj];
  iVar1 = p->LevelMax + (uint)((byte)((p->vObjType).pArray[(uint)iObj] - 5U) < 0xfe);
  if (iVar2 <= iVar1) {
    return iVar1 - iVar2;
  }
  __assert_fail("!Acb_ObjIsCio(p, iObj) + p->LevelMax >= LevelSum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                ,0xab,"int Acb_ObjSlack(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjSlack( Acb_Ntk_t * p, int iObj )
{
    int LevelSum = Acb_ObjLevelD(p, iObj) + Acb_ObjLevelR(p, iObj);
    assert( !Acb_ObjIsCio(p, iObj) + p->LevelMax >= LevelSum );
    return !Acb_ObjIsCio(p, iObj) + p->LevelMax - LevelSum;
}